

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_intersection.cc
# Opt level: O0

void __thiscall
S2RegionIntersection::S2RegionIntersection(S2RegionIntersection *this,S2RegionIntersection *src)

{
  int iVar1;
  reference this_00;
  S2Region *pSVar2;
  undefined4 extraout_var;
  int local_2c;
  allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_> local_25;
  int i;
  S2RegionIntersection *local_18;
  S2RegionIntersection *src_local;
  S2RegionIntersection *this_local;
  
  local_18 = src;
  src_local = this;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2RegionIntersection_0062eec8;
  iVar1 = num_regions(local_18);
  std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>::allocator(&local_25);
  std::
  vector<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
  ::vector(&this->regions_,(long)iVar1,&local_25);
  std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>::~allocator(&local_25);
  local_2c = 0;
  while( true ) {
    iVar1 = num_regions(this);
    if (iVar1 <= local_2c) break;
    this_00 = std::
              vector<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>,_std::allocator<std::unique_ptr<S2Region,_std::default_delete<S2Region>_>_>_>
              ::operator[](&this->regions_,(long)local_2c);
    pSVar2 = region(local_18,local_2c);
    iVar1 = (*pSVar2->_vptr_S2Region[2])();
    std::unique_ptr<S2Region,_std::default_delete<S2Region>_>::reset
              (this_00,(pointer)CONCAT44(extraout_var,iVar1));
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

S2RegionIntersection::S2RegionIntersection(const S2RegionIntersection& src)
  : regions_(src.num_regions()) {
  for (int i = 0; i < num_regions(); ++i) {
    regions_[i].reset(src.region(i)->Clone());
  }
}